

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O1

void Ppmd7_Update1(CPpmd7 *p)

{
  UInt16 *pUVar1;
  UInt16 UVar2;
  CPpmd_State *pCVar3;
  Byte BVar4;
  UInt16 UVar5;
  Byte BVar6;
  Byte BVar7;
  UInt16 UVar8;
  byte bVar9;
  CPpmd_State tmp;
  
  pCVar3 = p->FoundState;
  bVar9 = pCVar3->Freq + 4;
  pCVar3->Freq = bVar9;
  pUVar1 = &p->MinContext->SummFreq;
  *pUVar1 = *pUVar1 + 4;
  if (pCVar3[-1].Freq < bVar9) {
    UVar2 = pCVar3->SuccessorHigh;
    BVar6 = pCVar3->Symbol;
    BVar7 = pCVar3->Freq;
    UVar8 = pCVar3->SuccessorLow;
    BVar4 = pCVar3[-1].Freq;
    UVar5 = pCVar3[-1].SuccessorLow;
    pCVar3->Symbol = pCVar3[-1].Symbol;
    pCVar3->Freq = BVar4;
    pCVar3->SuccessorLow = UVar5;
    pCVar3->SuccessorHigh = pCVar3[-1].SuccessorHigh;
    pCVar3[-1].Symbol = BVar6;
    pCVar3[-1].Freq = BVar7;
    pCVar3[-1].SuccessorLow = UVar8;
    pCVar3[-1].SuccessorHigh = UVar2;
    p->FoundState = pCVar3 + -1;
    if (0x7c < pCVar3[-1].Freq) {
      Rescale(p);
    }
  }
  NextContext(p);
  return;
}

Assistant:

static void Ppmd7_Update1(CPpmd7 *p)
{
  CPpmd_State *s = p->FoundState;
  s->Freq += 4;
  p->MinContext->SummFreq += 4;
  if (s[0].Freq > s[-1].Freq)
  {
    SwapStates(&s[0], &s[-1]);
    p->FoundState = --s;
    if (s->Freq > MAX_FREQ)
      Rescale(p);
  }
  NextContext(p);
}